

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int str_comp_filenames(char *a,char *b)

{
  int iVar1;
  int iVar2;
  __int32_t **pp_Var3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    bVar4 = *a;
    bVar5 = *b;
    if (bVar4 == 0) {
LAB_0013e79e:
      pp_Var3 = __ctype_tolower_loc();
      return (*pp_Var3)[lVar6] - (*pp_Var3)[(char)bVar5];
    }
    if (bVar5 == 0) {
      bVar5 = 0;
LAB_0013e79a:
      lVar6 = (long)(char)bVar4;
      goto LAB_0013e79e;
    }
    if (((byte)(bVar4 - 0x30) < 10) && ((byte)(bVar5 - 0x30) < 10)) {
      iVar2 = 0;
      while( true ) {
        a = (char *)((byte *)a + 1);
        b = (char *)((byte *)b + 1);
        iVar1 = (uint)bVar4 - (uint)bVar5;
        if (iVar2 != 0) {
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        bVar4 = *a;
        bVar5 = *b;
        if (9 < (byte)(bVar4 - 0x30)) break;
        if (9 < (byte)(bVar5 - 0x30)) {
          return 1;
        }
      }
      if ((byte)(bVar5 - 0x30) < 10) {
        return -1;
      }
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    pp_Var3 = __ctype_tolower_loc();
    if ((*pp_Var3)[(char)bVar4] != (*pp_Var3)[(char)bVar5]) goto LAB_0013e79a;
    a = (char *)((byte *)a + 1);
    b = (char *)((byte *)b + 1);
  } while( true );
}

Assistant:

int str_comp_filenames(const char *a, const char *b)
{
	int result;

	for(; *a && *b; ++a, ++b)
	{
		if(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9')
		{
			result = 0;
			do
			{
				if(!result)
					result = *a - *b;
				++a; ++b;
			}
			while(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9');

			if(*a >= '0' && *a <= '9')
				return 1;
			else if(*b >= '0' && *b <= '9')
				return -1;
			else if(result)
				return result;
		}

		if(tolower(*a) != tolower(*b))
			break;
	}
	return tolower(*a) - tolower(*b);
}